

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O3

idx_t __thiscall
duckdb::StrfTimeFormat::GetLength
          (StrfTimeFormat *this,date_t date,dtime_t time,int32_t utc_offset,char *tz_name)

{
  StrTimeSpecifier *pSVar1;
  idx_t iVar2;
  const_iterator __begin2;
  StrTimeSpecifier *pSVar3;
  idx_t iVar4;
  int32_t data [8];
  int32_t iStack_58;
  int32_t local_54;
  int32_t local_50;
  int32_t local_4c;
  int32_t local_48;
  int32_t local_44;
  int local_40;
  int32_t local_3c;
  
  if ((this->var_length_specifiers).
      super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
      super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->var_length_specifiers).
      super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
      super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    iVar4 = (this->super_StrTimeFormat).constant_size;
  }
  else {
    Date::Convert(date,&iStack_58,&local_54,&local_50);
    Time::Convert(time,&local_4c,&local_48,&local_44,&local_40);
    local_40 = local_40 * 1000;
    iVar4 = (this->super_StrTimeFormat).constant_size;
    pSVar1 = (this->var_length_specifiers).
             super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
             super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_3c = utc_offset;
    for (pSVar3 = (this->var_length_specifiers).
                  super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
                  super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
                  ._M_impl.super__Vector_impl_data._M_start; pSVar3 != pSVar1; pSVar3 = pSVar3 + 1)
    {
      iVar2 = GetSpecifierLength(*pSVar3,date,&iStack_58,tz_name);
      iVar4 = iVar4 + iVar2;
    }
  }
  return iVar4;
}

Assistant:

idx_t StrfTimeFormat::GetLength(date_t date, dtime_t time, int32_t utc_offset, const char *tz_name) {
	if (!var_length_specifiers.empty()) {
		int32_t data[8];
		Date::Convert(date, data[0], data[1], data[2]);
		Time::Convert(time, data[3], data[4], data[5], data[6]);
		data[6] *= Interval::NANOS_PER_MICRO;
		data[7] = utc_offset;
		return GetLength(date, data, tz_name);
	}
	return constant_size;
}